

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeImpl.hh
# Opt level: O0

void __thiscall avro::NodeMap::NodeMap(NodeMap *this,SingleLeaf *values)

{
  shared_ptr<avro::Node> *__a;
  shared_ptr<avro::Node> *psVar1;
  MultiAttribute<boost::shared_ptr<avro::Node>_> *in_RDI;
  NodePtr key;
  undefined4 in_stack_ffffffffffffff78;
  Type in_stack_ffffffffffffff7c;
  MultiAttribute<boost::shared_ptr<avro::Node>_> *in_stack_ffffffffffffff80;
  NoAttribute<int> *in_stack_ffffffffffffff88;
  NoAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff90;
  undefined1 local_58 [4];
  Type in_stack_ffffffffffffffac;
  NodeImpl<avro::concepts::NoAttribute<avro::Name>,_avro::concepts::MultiAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::NoAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::NoAttribute<int>_>
  *in_stack_ffffffffffffffb0;
  shared_ptr<avro::Node> local_30 [3];
  
  psVar1 = local_30;
  concepts::MultiAttribute<boost::shared_ptr<avro::Node>_>::MultiAttribute
            ((MultiAttribute<boost::shared_ptr<avro::Node>_> *)psVar1,
             (SingleAttribute<boost::shared_ptr<avro::Node>_> *)in_RDI);
  NodeImpl<avro::concepts::NoAttribute<avro::Name>,_avro::concepts::MultiAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::NoAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::NoAttribute<int>_>
  ::NodeImpl(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,(NoAttribute<avro::Name> *)psVar1,
             in_RDI,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  concepts::MultiAttribute<boost::shared_ptr<avro::Node>_>::~MultiAttribute
            ((MultiAttribute<boost::shared_ptr<avro::Node>_> *)0x1f2da4);
  (in_RDI->attrs_).
  super__Vector_base<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__NodeMap_00264ee0;
  __a = (shared_ptr<avro::Node> *)operator_new(0x18);
  NodePrimitive::NodePrimitive((NodePrimitive *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c)
  ;
  boost::shared_ptr<avro::Node>::shared_ptr<avro::NodePrimitive>(psVar1,(NodePrimitive *)in_RDI);
  (*(code *)(in_RDI->attrs_).
            super__Vector_base<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>
            ._M_impl.super__Vector_impl_data._M_start[9].px)(in_RDI,local_58);
  psVar1 = concepts::MultiAttribute<boost::shared_ptr<avro::Node>_>::get
                     (in_stack_ffffffffffffff80,
                      CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  concepts::MultiAttribute<boost::shared_ptr<avro::Node>_>::get
            (in_stack_ffffffffffffff80,CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)
            );
  std::swap<boost::shared_ptr<avro::Node>>(__a,psVar1);
  boost::shared_ptr<avro::Node>::~shared_ptr((shared_ptr<avro::Node> *)0x1f2e4b);
  return;
}

Assistant:

explicit NodeMap(const SingleLeaf &values) :
        NodeImplMap(AVRO_MAP, NoName(), values, NoLeafNames(), NoSize())
    { 
        // need to add the key for the map too
        NodePtr key(new NodePrimitive(AVRO_STRING));
        doAddLeaf(key);

        // key goes before value
        std::swap(leafAttributes_.get(0), leafAttributes_.get(1));
    }